

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequentialModule.cpp
# Opt level: O2

tensor __thiscall module::SequentialModule::predict(SequentialModule *this,tensor in)

{
  pointer ppLVar1;
  pointer ppLVar2;
  ulong uVar3;
  tensor ppplVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int z;
  ulong uVar9;
  ulong uVar10;
  
  uVar5 = 0;
  uVar10 = (ulong)(uint)this->_sizeYIn;
  if (this->_sizeYIn < 1) {
    uVar10 = uVar5;
  }
  uVar3 = (ulong)(uint)this->_sizeXIn;
  if (this->_sizeXIn < 1) {
    uVar3 = uVar5;
  }
  for (uVar6 = 0; uVar6 != uVar3; uVar6 = uVar6 + 1) {
    uVar7 = (ulong)(uint)this->_sizeZIn;
    if (this->_sizeZIn < 1) {
      uVar7 = uVar5;
    }
    for (uVar8 = 0; uVar8 != uVar10; uVar8 = uVar8 + 1) {
      ppplVar4 = this->_in;
      for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
        ppplVar4[uVar9][uVar8][uVar6] = in[uVar9][uVar8][uVar6];
      }
    }
  }
  uVar10 = 0;
  while( true ) {
    ppLVar1 = (this->_lLayers).super__Vector_base<layer::Layer_*,_std::allocator<layer::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppLVar2 = (this->_lLayers).super__Vector_base<layer::Layer_*,_std::allocator<layer::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppLVar2 - (long)ppLVar1 >> 3) <= uVar10) break;
    (*ppLVar1[uVar10]->_vptr_Layer[3])();
    uVar10 = uVar10 + 1;
  }
  ppplVar4 = layer::Layer::getPtrOut(ppLVar2[-1]);
  return ppplVar4;
}

Assistant:

type::tensor SequentialModule::predict(type::tensor in)
    {
        for(int x(0); x < _sizeXIn; x++)
            for(int y(0); y < _sizeYIn; y++)
                for(int z(0); z < _sizeZIn; z++)
                    _in[z][y][x] = in[z][y][x];

        for(int itLayer(0); itLayer < _lLayers.size(); itLayer++)
            _lLayers[itLayer]->predict();
        return _lLayers.back()->getPtrOut();
    }